

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPServer.cpp
# Opt level: O0

void __thiscall SocketPP::TCPServer::onDisconnected(TCPServer *this,int fd)

{
  bool bVar1;
  char *pcVar2;
  size_type sVar3;
  char *local_b8;
  char *local_b0;
  char *local_a0;
  char *local_98;
  TCPStream local_74;
  TCPStream *local_70;
  TCPStream *local_68;
  undefined4 local_5c;
  __normal_iterator<const_SocketPP::TCPStream_*,_std::vector<SocketPP::TCPStream,_std::allocator<SocketPP::TCPStream>_>_>
  local_58 [3];
  int *local_40;
  TCPStream *local_38;
  __normal_iterator<const_SocketPP::TCPStream_*,_std::vector<SocketPP::TCPStream,_std::allocator<SocketPP::TCPStream>_>_>
  local_30;
  __normal_iterator<const_SocketPP::TCPStream_*,_std::vector<SocketPP::TCPStream,_std::allocator<SocketPP::TCPStream>_>_>
  local_28;
  __normal_iterator<const_SocketPP::TCPStream_*,_std::vector<SocketPP::TCPStream,_std::allocator<SocketPP::TCPStream>_>_>
  iter;
  lock_guard<std::mutex> lockStream;
  int fd_local;
  TCPServer *this_local;
  
  lockStream._M_device._4_4_ = fd;
  std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)&iter,&this->streamMutex_);
  local_30._M_current =
       (TCPStream *)
       std::vector<SocketPP::TCPStream,_std::allocator<SocketPP::TCPStream>_>::cbegin
                 (&this->connectedStreams_);
  local_38 = (TCPStream *)
             std::vector<SocketPP::TCPStream,_std::allocator<SocketPP::TCPStream>_>::cend
                       (&this->connectedStreams_);
  local_40 = (int *)((long)&lockStream._M_device + 4);
  local_28 = std::
             find_if<__gnu_cxx::__normal_iterator<SocketPP::TCPStream_const*,std::vector<SocketPP::TCPStream,std::allocator<SocketPP::TCPStream>>>,SocketPP::TCPServer::onDisconnected(int)::__0>
                       (local_30,(__normal_iterator<const_SocketPP::TCPStream_*,_std::vector<SocketPP::TCPStream,_std::allocator<SocketPP::TCPStream>_>_>
                                  )local_38,(anon_class_8_1_3fcf657c_for__M_pred)local_40);
  local_58[0]._M_current =
       (TCPStream *)
       std::vector<SocketPP::TCPStream,_std::allocator<SocketPP::TCPStream>_>::cend
                 (&this->connectedStreams_);
  bVar1 = __gnu_cxx::operator==(&local_28,local_58);
  if (bVar1) {
    pcVar2 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/TCPServer.cpp"
                     ,0x2f);
    if (pcVar2 == (char *)0x0) {
      pcVar2 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/TCPServer.cpp"
                       ,0x5c);
      if (pcVar2 == (char *)0x0) {
        local_a0 = 
        "/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/TCPServer.cpp"
        ;
      }
      else {
        local_a0 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/TCPServer.cpp"
                           ,0x5c);
        local_a0 = local_a0 + 1;
      }
      local_98 = local_a0;
    }
    else {
      local_98 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/TCPServer.cpp"
                         ,0x2f);
      local_98 = local_98 + 1;
    }
    printf("\x1b[31mERROR: %s: %s: %d: fd:%d is not in connectedStreams_!\x1b[m\n",local_98,
           "onDisconnected",0xa6,(ulong)lockStream._M_device._4_4_);
    local_5c = 1;
  }
  else {
    local_68 = local_28._M_current;
    local_70 = (TCPStream *)
               std::vector<SocketPP::TCPStream,_std::allocator<SocketPP::TCPStream>_>::erase
                         (&this->connectedStreams_,(const_iterator)local_28._M_current);
    pcVar2 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/TCPServer.cpp"
                     ,0x2f);
    if (pcVar2 == (char *)0x0) {
      pcVar2 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/TCPServer.cpp"
                       ,0x5c);
      if (pcVar2 == (char *)0x0) {
        local_b8 = 
        "/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/TCPServer.cpp"
        ;
      }
      else {
        local_b8 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/TCPServer.cpp"
                           ,0x5c);
        local_b8 = local_b8 + 1;
      }
      local_b0 = local_b8;
    }
    else {
      local_b0 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/TCPServer.cpp"
                         ,0x2f);
      local_b0 = local_b0 + 1;
    }
    sVar3 = std::vector<SocketPP::TCPStream,_std::allocator<SocketPP::TCPStream>_>::size
                      (&this->connectedStreams_);
    printf("\x1b[33m%s: connectedStreams_.size()=%ld\x1b[m\n",local_b0,sVar3);
    bVar1 = std::function::operator_cast_to_bool((function *)&this->discHandle_);
    if (bVar1) {
      TCPStream::TCPStream(&local_74,lockStream._M_device._4_4_);
      std::function<void_(const_SocketPP::TCPStream_&)>::operator()(&this->discHandle_,&local_74);
    }
    local_5c = 0;
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&iter);
  return;
}

Assistant:

void TCPServer::onDisconnected(int fd) {
    std::lock_guard<std::mutex> lockStream(streamMutex_);
    auto iter = std::find_if(connectedStreams_.cbegin(), connectedStreams_.cend(),
                             [&](TCPStream stream) { return stream.fd == fd; });

    if (iter == connectedStreams_.cend()) {
        LOGE("fd:%d is not in connectedStreams_!", fd);
        return;
    }

    connectedStreams_.erase(iter);

    LOGD("connectedStreams_.size()=%ld", connectedStreams_.size());

    if (discHandle_)
        discHandle_(fd);
}